

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O1

int32_t conv_code_pdg2phits(int32_t c)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  int key;
  uint local_c;
  
  local_c = -c;
  if (0 < c) {
    local_c = c;
  }
  if (local_c < 0x3b9aca01) {
    pvVar2 = bsearch(&local_c,phits_known_nonion_codes,0x14,4,phits_cmp_codes);
    iVar1 = 0;
    if ((pvVar2 != (void *)0x0) && ((-1 < c || (((c != -0x14b && (c != -0x6f)) && (c != -0x16))))))
    {
      iVar1 = c;
    }
  }
  else {
    iVar1 = 0;
    if (local_c < 0x3c336077 && -1 < c) {
      uVar3 = local_c / 10 + (local_c / 10000) * -1000;
      iVar4 = local_c / 10000 + (local_c / 10000000) * -1000;
      iVar1 = iVar4 * 1000000 + uVar3;
      if (uVar3 <= iVar4 - 1U) {
        iVar1 = 0;
      }
      if (0x19999999 <
          (local_c * -0x33333333 >> 1 | (uint)((local_c * -0x33333333 & 1) != 0) << 0x1f)) {
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int32_t conv_code_pdg2phits( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if ( absc <= 1000000000 ) {
    //Presumably PHITS use pdg codes directly for non-nuclei/ions, but only with
    //room for 6 digits. And in fact, only those in the phits_known_nonion_codes
    //are supported - and for 22, 111, 331 only if not negative (these particles
    //are their own antiparticles):
    int key = absc;
    void * res = bsearch(&key, phits_known_nonion_codes, sizeof(phits_known_nonion_codes) / sizeof(phits_known_nonion_codes[0]),
                         sizeof(phits_known_nonion_codes[0]), phits_cmp_codes);
    if ( !res || ( c < 0 && (c==-22||c==-111||c==-331) ) )
      return 0;
    return c;
  }
  if (absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
    if (c<0)
      return 0;//Negative ions seems to not actually be supported in PHITS.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    if ( !(absc/1000==100) ) {
      //L=0 guaranteed by enclosing condition.
      phits_error("pdgcode conversion logic error");
    }
    if ( I || !A || !Z || Z>A )
      return 0;
    //PHITS encode nucleis as Z*1000000+A:
    int32_t absphitscode = Z*1000000+A;
    return c < 0 ? -absphitscode : absphitscode;
  }
  return 0;
}